

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeConvolution(ConvertLayerParameters layerParameters)

{
  Rep *pRVar1;
  string *psVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar3;
  bool bVar4;
  int iVar5;
  uint32 uVar6;
  uint uVar7;
  uint32 uVar8;
  uint32 uVar9;
  Type *caffeLayer;
  Type *pTVar10;
  ConvolutionLayerParams *this;
  Type *pTVar11;
  BlobShape *pBVar12;
  ValidPadding *pVVar13;
  BorderAmounts *pBVar14;
  BorderAmounts_EdgeSizes *pBVar15;
  WeightParams *pWVar16;
  void **ppvVar17;
  uint64 value;
  ConvolutionParameter *from;
  string *psVar18;
  RepeatedPtrField<caffe::BlobProto> *pRVar19;
  uint64 value_00;
  ulong uVar20;
  long lVar21;
  long lVar22;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_208;
  uint local_1fc;
  uint64 local_1f8;
  Type *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  uint64 local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  ConvolutionParameter caffeLayerParams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_90;
  string local_70;
  string local_50;
  
  caffeLayer = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                          *layerParameters.layerId);
  iVar5 = getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      (&((layerParameters.protoweights)->layer_).super_RepeatedPtrFieldBase,iVar5);
  local_1f0 = (Type *)google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>
                      ::Add(layerParameters.nnWrite);
  local_208 = layerParameters.mappingDataBlobNames;
  if (((caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar22 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&caffeLayerParams,"Must have 1 input and 1 output",(allocator *)&local_248)
    ;
    errorInCaffeProto((string *)&caffeLayerParams,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_)
    ;
    std::__cxx11::string::~string((string *)&caffeLayerParams);
    lVar22 = (long)(caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar1 = (caffeLayer->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar17 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar17 = (void **)0x0;
  }
  for (lVar21 = 0; lVar22 * 8 != lVar21; lVar21 = lVar21 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar17 + lVar21));
  }
  pRVar1 = (caffeLayer->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar17 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar17 = (void **)0x0;
  }
  iVar5 = (caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar22 = 0; (long)iVar5 * 8 != lVar22; lVar22 = lVar22 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar17 + lVar22));
  }
  convertCaffeMetadata((caffeLayer->name_).ptr_,&bottom,&top,layerParameters.nnWrite,local_208);
  from = caffeLayer->convolution_param_;
  if (from == (ConvolutionParameter *)0x0) {
    from = (ConvolutionParameter *)&caffe::_ConvolutionParameter_default_instance_;
  }
  caffe::ConvolutionParameter::ConvolutionParameter(&caffeLayerParams,from);
  this = CoreML::Specification::NeuralNetworkLayer::mutable_convolution
                   ((NeuralNetworkLayer *)local_1f0);
  if ((pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    std::__cxx11::string::string
              ((string *)&local_248,"Weight blobs not provided",(allocator *)&local_228);
    errorInCaffeProto(&local_248,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_248);
  }
  uVar20 = (ulong)caffeLayerParams.group_;
  local_208 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(ulong)caffeLayerParams.num_output_;
  local_1f0 = pTVar10;
  if (uVar20 == 0) {
    std::__cxx11::string::string
              ((string *)&local_248,"group parameter cannot be 0",(allocator *)&local_228);
    errorInCaffeProto(&local_248,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_248);
  }
  if ((local_1f0->blobs_).super_RepeatedPtrFieldBase.current_size_ - 1U < 2) {
    pRVar19 = &local_1f0->blobs_;
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        (&pRVar19->super_RepeatedPtrFieldBase,0);
    pBVar12 = pTVar11->shape_;
    if (pBVar12 == (BlobShape *)0x0) {
      pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    if ((pBVar12->dim_).current_size_ == 0) {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&pRVar19->super_RepeatedPtrFieldBase,0);
      local_1f8 = (uint64)pTVar11->num_;
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&pRVar19->super_RepeatedPtrFieldBase,0);
      local_1c8 = (uint64)pTVar11->channels_;
    }
    else {
      bVar4 = std::operator==((caffeLayer->type_).ptr_,"Deconvolution");
      if (bVar4) {
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,0);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        local_1f8 = caffe::BlobShape::dim(pBVar12,1);
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,0);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        local_1c8 = caffe::BlobShape::dim(pBVar12,0);
      }
      else {
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,0);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        local_1f8 = caffe::BlobShape::dim(pBVar12,0);
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,0);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        local_1c8 = caffe::BlobShape::dim(pBVar12,1);
      }
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_248,"Number of blobs must be 2 or 1 (when there is no bias)",
               (allocator *)&local_228);
    errorInCaffeProto(&local_248,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_248);
    local_1c8 = 0;
    local_1f8 = 0;
  }
  local_1fc = 0;
  if (1 < (local_1f0->blobs_).super_RepeatedPtrFieldBase.current_size_) {
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        (&(local_1f0->blobs_).super_RepeatedPtrFieldBase,1);
    local_1fc = (pTVar11->data_).current_size_;
  }
  bVar4 = std::operator==((caffeLayer->type_).ptr_,"Deconvolution");
  if (bVar4) {
    if (local_1f8 * uVar20 - (long)local_208 == 0) goto LAB_0048316d;
    std::__cxx11::to_string(&local_50,(uint)local_208);
    std::operator+(&local_1c0,"\'num_output\' (",&local_50);
    std::operator+(&local_1a0,&local_1c0,") divided by groups (");
    std::__cxx11::to_string(&local_70,caffeLayerParams.group_);
    std::operator+(&local_180,&local_1a0,&local_70);
    std::operator+(&local_1e8,&local_180,"does not match the first dimension of weights (");
    std::__cxx11::to_string(&local_90,local_1f8);
    std::operator+(&local_228,&local_1e8,&local_90);
    std::operator+(&local_248,&local_228,")");
    errorInCaffeProto(&local_248,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    psVar18 = &local_50;
  }
  else {
    if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_1f8 != local_208) {
      std::__cxx11::to_string(&local_1a0,(uint)local_208);
      std::operator+(&local_180,"\'num_output\' (",&local_1a0);
      std::operator+(&local_1e8,&local_180,") does not match the first dimension of weights (");
      std::__cxx11::to_string(&local_1c0,local_1f8);
      std::operator+(&local_228,&local_1e8,&local_1c0);
      std::operator+(&local_248,&local_228,")");
      errorInCaffeProto(&local_248,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    if ((int)(((ulong)local_208 & 0xffffffff) % uVar20) == 0) goto LAB_0048316d;
    std::__cxx11::to_string(&local_1a0,(uint)local_208);
    std::operator+(&local_180,"\'num_output\' (",&local_1a0);
    std::operator+(&local_1e8,&local_180,") must be divisible by \'groups\' (");
    std::__cxx11::to_string(&local_1c0,caffeLayerParams.group_);
    std::operator+(&local_228,&local_1e8,&local_1c0);
    std::operator+(&local_248,&local_228,")");
    errorInCaffeProto(&local_248,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_180);
    psVar18 = &local_1a0;
  }
  std::__cxx11::string::~string((string *)psVar18);
LAB_0048316d:
  bVar4 = (int)local_1fc < 1;
  if (caffeLayerParams.bias_term_ != false) {
    bVar4 = local_1fc != 0;
  }
  if (!bVar4) {
    std::__cxx11::string::string
              ((string *)&local_248,"\'bias_term\' flag and blob size for bias incompatible",
               (allocator *)&local_228);
    errorInCaffeProto(&local_248,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_248);
  }
  if (caffeLayerParams.axis_ != 1) {
    std::__cxx11::string::string((string *)&local_248,"axis",(allocator *)&local_1e8);
    psVar18 = (caffeLayer->name_).ptr_;
    psVar2 = (caffeLayer->type_).ptr_;
    std::__cxx11::to_string(&local_228,caffeLayerParams.axis_);
    unsupportedCaffeParrameterWithOption(&local_248,psVar18,psVar2,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
  }
  if (2 < caffeLayerParams.kernel_size_.current_size_) {
    std::__cxx11::string::string
              ((string *)&local_248,"Number of kernel size values",(allocator *)&local_1e8);
    psVar18 = (caffeLayer->name_).ptr_;
    psVar2 = (caffeLayer->type_).ptr_;
    std::__cxx11::to_string(&local_228,caffeLayerParams.kernel_size_.current_size_);
    unsupportedCaffeParrameterWithOption(&local_248,psVar18,psVar2,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
  }
  if (2 < caffeLayerParams.pad_.current_size_) {
    std::__cxx11::string::string
              ((string *)&local_248,"Number of pad values",(allocator *)&local_1e8);
    psVar18 = (caffeLayer->name_).ptr_;
    psVar2 = (caffeLayer->type_).ptr_;
    std::__cxx11::to_string(&local_228,caffeLayerParams.pad_.current_size_);
    unsupportedCaffeParrameterWithOption(&local_248,psVar18,psVar2,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
  }
  if (2 < caffeLayerParams.stride_.current_size_) {
    std::__cxx11::string::string
              ((string *)&local_248,"Number of stride values",(allocator *)&local_1e8);
    psVar18 = (caffeLayer->name_).ptr_;
    psVar2 = (caffeLayer->type_).ptr_;
    std::__cxx11::to_string(&local_228,caffeLayerParams.stride_.current_size_);
    unsupportedCaffeParrameterWithOption(&local_248,psVar18,psVar2,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
  }
  if (2 < caffeLayerParams.dilation_.current_size_) {
    std::__cxx11::string::string
              ((string *)&local_248,"Number of dilation size values",(allocator *)&local_1e8);
    psVar18 = (caffeLayer->name_).ptr_;
    psVar2 = (caffeLayer->type_).ptr_;
    std::__cxx11::to_string(&local_228,caffeLayerParams.dilation_.current_size_);
    unsupportedCaffeParrameterWithOption(&local_248,psVar18,psVar2,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
  }
  bVar4 = std::operator==((caffeLayer->type_).ptr_,"Deconvolution");
  this->isdeconvolution_ = bVar4;
  this->hasbias_ = caffeLayerParams.bias_term_;
  this->ngroups_ = uVar20;
  local_248._M_dataplus._M_p = (pointer)0x0;
  google::protobuf::RepeatedField<unsigned_long>::Resize
            (&this->stride_,2,(unsigned_long *)&local_248);
  if (caffeLayerParams.stride_.current_size_ == 0) {
    if (caffeLayerParams.stride_h_ == 0) {
      caffeLayerParams.stride_h_ = 1;
      uVar6 = 1;
    }
    else {
      uVar6 = caffeLayerParams.stride_w_ + (caffeLayerParams.stride_w_ == 0);
      if (caffeLayerParams.stride_w_ == 0) {
        caffeLayerParams.stride_h_ = 1;
      }
    }
  }
  else {
    caffeLayerParams.stride_h_ = caffe::ConvolutionParameter::stride(&caffeLayerParams,0);
    uVar6 = caffeLayerParams.stride_h_;
    if (caffeLayerParams.stride_.current_size_ != 1) {
      uVar6 = caffe::ConvolutionParameter::stride(&caffeLayerParams,1);
    }
  }
  CoreML::Specification::ConvolutionLayerParams::set_stride
            (this,0,(ulong)caffeLayerParams.stride_h_);
  CoreML::Specification::ConvolutionLayerParams::set_stride(this,1,(ulong)uVar6);
  local_248._M_dataplus._M_p = (pointer)0x0;
  google::protobuf::RepeatedField<unsigned_long>::Resize
            (&this->kernelsize_,2,(unsigned_long *)&local_248);
  if (caffeLayerParams.kernel_size_.current_size_ == 0) {
    uVar7 = caffeLayerParams.kernel_w_;
    uVar6 = caffeLayerParams.kernel_h_;
    if (caffeLayerParams.kernel_w_ == 0 || caffeLayerParams.kernel_h_ == 0) {
      std::__cxx11::string::string
                ((string *)&local_248,"Kernel size cannot be 0",(allocator *)&local_228);
      errorInCaffeProto(&local_248,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
      std::__cxx11::string::~string((string *)&local_248);
      uVar7 = 3;
      uVar6 = uVar7;
    }
  }
  else {
    uVar6 = caffe::ConvolutionParameter::kernel_size(&caffeLayerParams,0);
    uVar7 = uVar6;
    if (caffeLayerParams.kernel_size_.current_size_ != 1) {
      uVar7 = caffe::ConvolutionParameter::kernel_size(&caffeLayerParams,1);
    }
  }
  CoreML::Specification::ConvolutionLayerParams::set_kernelsize(this,0,(ulong)uVar6);
  value = 1;
  CoreML::Specification::ConvolutionLayerParams::set_kernelsize(this,1,(ulong)uVar7);
  uVar8 = caffeLayerParams.pad_h_;
  uVar9 = caffeLayerParams.pad_w_;
  if ((caffeLayerParams.pad_.current_size_ != 0) &&
     (uVar8 = caffe::ConvolutionParameter::pad(&caffeLayerParams,0), uVar9 = uVar8,
     caffeLayerParams.pad_.current_size_ != 1)) {
    uVar9 = caffe::ConvolutionParameter::pad(&caffeLayerParams,1);
  }
  if (uVar9 == 0 && uVar8 == 0) {
    CoreML::Specification::ConvolutionLayerParams::mutable_valid(this);
  }
  else {
    pVVar13 = CoreML::Specification::ConvolutionLayerParams::mutable_valid(this);
    pBVar14 = CoreML::Specification::ValidPadding::mutable_paddingamounts(pVVar13);
    pBVar15 = google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::
              Add(&pBVar14->borderamounts_);
    pBVar15->startedgesize_ = (ulong)uVar8;
    pBVar15->endedgesize_ = (ulong)uVar8;
    pVVar13 = CoreML::Specification::ConvolutionLayerParams::mutable_valid(this);
    pBVar14 = CoreML::Specification::ValidPadding::mutable_paddingamounts(pVVar13);
    pBVar15 = google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::
              Add(&pBVar14->borderamounts_);
    pBVar15->startedgesize_ = (ulong)uVar9;
    pBVar15->endedgesize_ = (ulong)uVar9;
  }
  local_248._M_dataplus._M_p = (pointer)0x0;
  google::protobuf::RepeatedField<unsigned_long>::Resize
            (&this->dilationfactor_,2,(unsigned_long *)&local_248);
  value_00 = 1;
  if (caffeLayerParams.dilation_.current_size_ != 0) {
    uVar8 = caffe::ConvolutionParameter::dilation(&caffeLayerParams,0);
    value = (uint64)uVar8;
    if (caffeLayerParams.dilation_.current_size_ == 1) {
      value_00 = (uint64)uVar8;
    }
    else {
      uVar8 = caffe::ConvolutionParameter::dilation(&caffeLayerParams,1);
      value_00 = (uint64)uVar8;
    }
  }
  CoreML::Specification::ConvolutionLayerParams::set_dilationfactor(this,0,value);
  CoreML::Specification::ConvolutionLayerParams::set_dilationfactor(this,1,value_00);
  this->outputchannels_ = (uint64)local_208;
  if ((long)local_1c8 < 0) {
    __assert_fail("kernelChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xe5,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  this->kernelchannels_ = local_1c8;
  pRVar19 = &local_1f0->blobs_;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,0);
  pmVar3 = local_208;
  iVar5 = (pTVar11->data_).current_size_;
  if ((long)iVar5 < 0) {
    __assert_fail("caffeBlobSizeWeights >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xeb,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  uVar20 = local_1f8 * local_1c8 * (ulong)uVar6 * (ulong)uVar7;
  if (uVar20 - (long)iVar5 != 0) {
    std::__cxx11::to_string(&local_1a0,uVar20);
    std::operator+(&local_180,"Expected blob size = ",&local_1a0);
    std::operator+(&local_1e8,&local_180," but found blob of size = ");
    std::__cxx11::to_string(&local_1c0,iVar5);
    std::operator+(&local_228,&local_1e8,&local_1c0);
    std::operator+(&local_248,&local_228," in caffe");
    errorInCaffeProto(&local_248,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  pWVar16 = CoreML::Specification::ConvolutionLayerParams::mutable_weights(this);
  if (uVar20 >> 0x1f != 0) {
    __assert_fail("blobSize <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xf0,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  local_248._M_dataplus._M_p = local_248._M_dataplus._M_p & 0xffffffff00000000;
  google::protobuf::RepeatedField<float>::Resize
            (&pWVar16->floatvalue_,(int)uVar20,(float *)&local_248);
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,0);
  google::protobuf::RepeatedField<float>::CopyFrom(&pWVar16->floatvalue_,&pTVar11->data_);
  if (caffeLayerParams.bias_term_ != false) {
    uVar7 = (uint)pmVar3;
    if (local_1fc != uVar7) {
      std::__cxx11::to_string(&local_1a0,uVar7);
      std::operator+(&local_180,"Expected blob size = ",&local_1a0);
      std::operator+(&local_1e8,&local_180," but found blob of size = ");
      std::__cxx11::to_string(&local_1c0,local_1fc);
      std::operator+(&local_228,&local_1e8,&local_1c0);
      std::operator+(&local_248,&local_228," in caffe");
      errorInCaffeProto(&local_248,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    pWVar16 = CoreML::Specification::ConvolutionLayerParams::mutable_bias(this);
    if ((int)uVar7 < 0) {
      __assert_fail("outputChannels <= INT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                    ,0xfb,
                    "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                   );
    }
    local_248._M_dataplus._M_p = local_248._M_dataplus._M_p & 0xffffffff00000000;
    google::protobuf::RepeatedField<float>::Resize(&pWVar16->floatvalue_,uVar7,(float *)&local_248);
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        (&pRVar19->super_RepeatedPtrFieldBase,1);
    google::protobuf::RepeatedField<float>::CopyFrom(&pWVar16->floatvalue_,&pTVar11->data_);
  }
  caffe::ConvolutionParameter::~ConvolutionParameter(&caffeLayerParams);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    caffe::ConvolutionParameter caffeLayerParams = caffeLayer.convolution_param();
    Specification::ConvolutionLayerParams* specLayerParams = specLayer->mutable_convolution();

    // weights shape for coreml and caffe:
    // convolution ==> [outputChannels, kernelChannels, kernelHeight, kernelWidth] == [outputChannelsWeight, kernelChannels, kernelHeight, kernelWidth]
    // deconvoltuion ==> [kernelChannels, outputChannels / nGroups, kernelHeight, kernelWidth] == [kernelChannels, outputChannelsWeight, kernelHeight, kernelWidth]
    uint32_t outputChannels = caffeLayerParams.num_output();
    int64_t outputChannelsWeight = 0;
    int64_t kernelChannels = 0;
    
    // First check that weights exist.
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto("Weight blobs not provided", caffeLayer.name(), caffeLayer.type());
    }
    
    //check that groups are not 0
    uint32_t numberGroups = caffeLayerParams.group();
    if (numberGroups==0) {
        CoreMLConverter::errorInCaffeProto("group parameter cannot be 0", caffeLayer.name(), caffeLayer.type());
    }
    
    if (caffeLayerWeights.blobs_size() == 2 || caffeLayerWeights.blobs_size() == 1){
        
        // Sometimes caffe models do not populate the shape (infering from other parameters)
        if (caffeLayerWeights.blobs(0).shape().dim_size() == 0) {
            outputChannelsWeight = caffeLayerWeights.blobs(0).num();
            kernelChannels = caffeLayerWeights.blobs(0).channels();
        } else {
            if (caffeLayer.type() == "Deconvolution") {
                outputChannelsWeight = caffeLayerWeights.blobs(0).shape().dim(1);
                kernelChannels = caffeLayerWeights.blobs(0).shape().dim(0);
            } else {
                outputChannelsWeight = caffeLayerWeights.blobs(0).shape().dim(0);
                kernelChannels = caffeLayerWeights.blobs(0).shape().dim(1);
            }
        }
    } else {
        CoreMLConverter::errorInCaffeProto("Number of blobs must be 2 or 1 (when there is no bias)", caffeLayer.name(), caffeLayer.type());
    }
    
    bool hasBias = caffeLayerParams.bias_term();
    int caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayer.type() == "Deconvolution") {
        if (outputChannels!= outputChannelsWeight * numberGroups){
            CoreMLConverter::errorInCaffeProto(
                                               "'num_output' ("+std::to_string(outputChannels)+") divided by groups (" + std::to_string(numberGroups) + "does not match the first dimension of weights ("+std::to_string(outputChannelsWeight)+")"
                                               ,caffeLayer.name(), caffeLayer.type());
        }
    } else {
        if (outputChannels!= outputChannelsWeight){
            CoreMLConverter::errorInCaffeProto(
                    "'num_output' ("+std::to_string(outputChannels)+") does not match the first dimension of weights ("+std::to_string(outputChannelsWeight)+")"
                            ,caffeLayer.name(), caffeLayer.type());
        }
        if (outputChannels % numberGroups != 0){
            CoreMLConverter::errorInCaffeProto("'num_output' ("+std::to_string(outputChannels)+") must be divisible by 'groups' (" + std::to_string(numberGroups) + ")"
                                               ,caffeLayer.name(), caffeLayer.type());
        }
    }
    if ( (hasBias && caffeBiasLength==0) || (!hasBias && caffeBiasLength>0)){
        CoreMLConverter::errorInCaffeProto("'bias_term' flag and blob size for bias incompatible", caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerParams.axis() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.kernel_size_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of kernel size values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.kernel_size_size()));
    }
    if (caffeLayerParams.pad_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of pad values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.pad_size()));
    }
    if (caffeLayerParams.stride_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of stride values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.stride_size()));
    }
    
    if (caffeLayerParams.dilation_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of dilation size values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.dilation_size()));
    }
    //**************************************************************
    
    if (caffeLayer.type() == "Deconvolution"){
        specLayerParams->set_isdeconvolution(true);
    } else {
        specLayerParams->set_isdeconvolution(false);
    }
    specLayerParams->set_hasbias(hasBias);
    assert(numberGroups >= 0);
    specLayerParams->set_ngroups(static_cast<uint64_t>(numberGroups));
    
    //Set Stride
    ::google::protobuf::RepeatedField<uint64_t>* stride = specLayerParams->mutable_stride();
    stride->Resize(2, 0);
    uint32_t heightStride, widthStride;
    heightStride = widthStride = 1;
    if (caffeLayerParams.stride_size() != 0) {
        heightStride = caffeLayerParams.stride(0);
        if (caffeLayerParams.stride_size() == 1){
            widthStride = heightStride;
        } else {
            widthStride = caffeLayerParams.stride(1);
        }
    } else if (caffeLayerParams.stride_h() != 0 && caffeLayerParams.stride_w() != 0) {
        heightStride = caffeLayerParams.stride_h();
        widthStride = caffeLayerParams.stride_w();
    }
    specLayerParams->set_stride(0, static_cast<uint64_t>(heightStride));
    specLayerParams->set_stride(1, static_cast<uint64_t>(widthStride));
    
    //Set Kernel sizes
    ::google::protobuf::RepeatedField<uint64_t>* kernelSize = specLayerParams->mutable_kernelsize();
    kernelSize->Resize(2, 0);
    uint32_t Kh, Kw;
    Kh = Kw = 3;
    if (caffeLayerParams.kernel_size_size() != 0) {
        Kh = caffeLayerParams.kernel_size(0);
        if (caffeLayerParams.kernel_size_size() == 1){
            Kw = Kh;
        } else {
            Kw = caffeLayerParams.kernel_size(1);
        }
    } else if (caffeLayerParams.kernel_h() != 0 && caffeLayerParams.kernel_w() != 0) {
        Kh = caffeLayerParams.kernel_h();
        Kw = caffeLayerParams.kernel_w();
    } else {
        CoreMLConverter::errorInCaffeProto("Kernel size cannot be 0", caffeLayer.name(), caffeLayer.type());
    }
    specLayerParams->set_kernelsize(0, static_cast<uint64_t>(Kh));
    specLayerParams->set_kernelsize(1, static_cast<uint64_t>(Kw));
    
    //Set padding params
    uint32_t pad_h = 0;
    uint32_t pad_w = 0;
    if (caffeLayerParams.pad_size() != 0) {
        pad_h = caffeLayerParams.pad(0);
        if (caffeLayerParams.pad_size()==1){
            pad_w = pad_h;
        } else {
            pad_w = caffeLayerParams.pad(1);
        }
    } else {
        pad_h = caffeLayerParams.pad_h();
        pad_w = caffeLayerParams.pad_w();
    }
    if (pad_w==0 && pad_h==0){
        (void) specLayerParams->mutable_valid();
    } else {
        auto heightBorder = specLayerParams->mutable_valid()->mutable_paddingamounts()->add_borderamounts();
        heightBorder->set_startedgesize(static_cast<uint64_t>(pad_h));
        heightBorder->set_endedgesize(static_cast<uint64_t>(pad_h));
        auto widthBorder = specLayerParams->mutable_valid()->mutable_paddingamounts()->add_borderamounts();
        widthBorder->set_startedgesize(static_cast<uint64_t>(pad_w));
        widthBorder->set_endedgesize(static_cast<uint64_t>(pad_w));
    }
    
    //Set dilation params
    ::google::protobuf::RepeatedField<uint64_t>* dilation = specLayerParams->mutable_dilationfactor();
    dilation->Resize(2, 0);
    uint32_t heightDilation, widthDilation;
    heightDilation = widthDilation = 1;
    if (caffeLayerParams.dilation_size() != 0) {
        heightDilation = caffeLayerParams.dilation(0);
        if (caffeLayerParams.dilation_size() == 1){
            widthDilation = heightDilation;
        } else {
            widthDilation = caffeLayerParams.dilation(1);
        }
    }
    specLayerParams->set_dilationfactor(0, static_cast<uint64_t>(heightDilation));
    specLayerParams->set_dilationfactor(1, static_cast<uint64_t>(widthDilation));
    
    // Write weights
    assert(outputChannels >= 0);
    specLayerParams->set_outputchannels(static_cast<uint64_t>(outputChannels));
    assert(kernelChannels >= 0);
    specLayerParams->set_kernelchannels(static_cast<uint64_t>(kernelChannels));
    
    uint64_t blobSize = static_cast<uint64_t>(outputChannelsWeight) * static_cast<uint64_t>(kernelChannels) * static_cast<uint64_t>(Kh) * static_cast<uint64_t>(Kw);
    
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    assert(caffeBlobSizeWeights >= 0);
    if (static_cast<uint64_t>(caffeBlobSizeWeights) != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string     (caffeBlobSizeWeights)+" in caffe", caffeLayer.name(), caffeLayer.type());
    }
    ::google::protobuf::RepeatedField<float>* weights = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weights->Resize(static_cast<int32_t>(blobSize), 0.0);
    weights->CopyFrom(caffeLayerWeights.blobs(0).data());
    
    // Write bias
    if (hasBias) {
        if (caffeBiasLength != static_cast<int32_t>(outputChannels)) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                              , caffeLayer.name(), caffeLayer.type());
        }
        ::google::protobuf::RepeatedField<float>* bias = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        bias->Resize(static_cast<int32_t>(outputChannels), 0.0);
        bias->CopyFrom(caffeLayerWeights.blobs(1).data());
    }
}